

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O1

int dfsplain_e(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  uVar1 = *(uint *)(pManMR->pDataArray + (uint)pObj->Id);
  if (((pManMR->constraintMask & uVar1 & 0x90) == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 2)) {
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = (ushort)uVar1 | 1;
    if (pManMR->fIsForward == 0) {
      if (0 < (pObj->vFanins).nSize) {
        lVar6 = 0;
        do {
          pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
          if (((undefined1  [24])
               ((undefined1  [24])pManMR->pDataArray[(uint)pAVar2->Id] & (undefined1  [24])0x2) ==
               (undefined1  [24])0x0) && (iVar3 = dfsplain_r(pAVar2,pPred), iVar3 != 0))
          goto LAB_0045c385;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pObj->vFanins).nSize);
      }
    }
    else if (0 < (pObj->vFanouts).nSize) {
      lVar6 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
        if (((undefined1  [24])
             ((undefined1  [24])pManMR->pDataArray[(uint)pAVar2->Id] & (undefined1  [24])0x2) ==
             (undefined1  [24])0x0) && (iVar3 = dfsplain_r(pAVar2,pPred), iVar3 != 0))
        goto LAB_0045c385;
        lVar6 = lVar6 + 1;
      } while (lVar6 < (pObj->vFanouts).nSize);
    }
    iVar3 = 0;
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
      if (pManMR->fIsForward == 0) {
        if (0 < (pObj->vFanouts).nSize) {
          lVar6 = 0;
          do {
            pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
            if (((undefined1  [24])
                 ((undefined1  [24])pManMR->pDataArray[(uint)pAVar2->Id] & (undefined1  [24])0x1) ==
                 (undefined1  [24])0x0) && (iVar3 = dfsplain_e(pAVar2,pPred), iVar3 != 0))
            goto LAB_0045c385;
            lVar6 = lVar6 + 1;
          } while (lVar6 < (pObj->vFanouts).nSize);
        }
        if (pManMR->maxDelay != 0) {
          if (0 < pManMR->vTimeEdges[(uint)pObj->Id].nSize) {
            pVVar5 = pManMR->vTimeEdges + (uint)pObj->Id;
            lVar6 = 0;
            do {
              if (((undefined1  [24])
                   ((undefined1  [24])
                    pManMR->pDataArray[(uint)((Abc_Obj_t *)pVVar5->pArray[lVar6])->Id] &
                   (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
                 (iVar3 = dfsplain_e((Abc_Obj_t *)pVVar5->pArray[lVar6],pPred), iVar3 != 0))
              goto LAB_0045c385;
              lVar6 = lVar6 + 1;
              pVVar5 = pManMR->vTimeEdges + (uint)pObj->Id;
            } while (lVar6 < pManMR->vTimeEdges[(uint)pObj->Id].nSize);
          }
        }
      }
      iVar3 = 0;
      if (((undefined1  [24])
           ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x6) ==
           (undefined1  [24])0x4) &&
         (iVar4 = dfsplain_r(pObj,pManMR->pDataArray[(uint)pObj->Id].field_1.pred), iVar4 != 0)) {
        *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
             *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffb;
        FSETPRED(pObj,(Abc_Obj_t *)0x0);
LAB_0045c385:
        iVar3 = 1;
      }
    }
  }
  else {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fret/fretFlow.c"
                    ,0x216,"int dfsplain_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
    iVar3 = 1;
    if (pManMR->fIsForward != 0) {
      __assert_fail("!pManMR->fIsForward",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fret/fretFlow.c"
                    ,0x217,"int dfsplain_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
  }
  return iVar3;
}

Assistant:

int dfsplain_e( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext;
  
  if (FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask || 
      Abc_ObjIsPi(pObj)) {
    assert(pPred);
    assert(!pManMR->fIsForward);
    return 1;
  }

  FSET(pObj, VISITED_E);
  
  // printf(" %de\n", Abc_ObjId(pObj));
  
  // 1. structural edges
  if (pManMR->fIsForward)
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  else
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  
  if (Abc_ObjIsLatch(pObj))
    return 0;

  // 2. reverse edges (backward retiming only)
  if (!pManMR->fIsForward) {
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_E) &&
          dfsplain_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }

  // 3. timing edges (backward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_E) &&
            dfsplain_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  // unwind
  if (FTEST(pObj, FLOW) && 
      !FTEST(pObj, VISITED_R) &&
      dfsplain_r(pObj, FGETPRED(pObj))) {
    FUNSET(pObj, FLOW);
    FSETPRED(pObj, NULL);
#ifdef DEBUG_PRINT_FLOWS
    printf("u");
#endif
    goto found;
  }
  
  return 0;
  
 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif

  return 1;
}